

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

FullLocation * __thiscall
slang::BumpAllocator::emplace<slang::parsing::Trivia::FullLocation>(BumpAllocator *this)

{
  FullLocation *this_00;
  size_t in_RDI;
  size_t unaff_retaddr;
  BumpAllocator *in_stack_00000008;
  
  this_00 = (FullLocation *)allocate(in_stack_00000008,unaff_retaddr,in_RDI);
  memset(this_00,0,0x18);
  parsing::Trivia::FullLocation::FullLocation(this_00);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }